

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

SimpleLeggedOdometry * __thiscall
iDynTree::SimpleLeggedOdometry::getWorldFrameTransform
          (SimpleLeggedOdometry *this,FrameIndex frame_index)

{
  char cVar1;
  char *pcVar2;
  Transform link_H_frame;
  
  if ((*(char *)(frame_index + 0x191) == '\x01') && (*(char *)(frame_index + 0x192) != '\0')) {
    cVar1 = iDynTree::Model::isValidFrameIndex(frame_index);
    if (cVar1 != '\0') {
      iDynTree::Model::getFrameLink(frame_index);
      iDynTree::Model::getFrameTransform((long)&stack0xffffffffffffff78);
      getWorldLinkTransform((SimpleLeggedOdometry *)&stack0xffffffffffffff18,frame_index);
      iDynTree::Transform::operator*((Transform *)this,(Transform *)&stack0xffffffffffffff18);
      return this;
    }
    pcVar2 = "getWorldLinkTransform was called, but the request linkindex is not part of the model";
  }
  else {
    pcVar2 = 
    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted."
    ;
  }
  iDynTree::reportError("SimpleLeggedOdometry","getWorldFrameTransform",pcVar2);
  iDynTree::Transform::Identity();
  return this;
}

Assistant:

Transform SimpleLeggedOdometry::getWorldFrameTransform(const FrameIndex frame_index)
{
    if( !this->m_kinematicsUpdated || !this->m_isOdometryInitialized  )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldFrameTransform",
                    "getWorldLinkTransform was called, but the kinematics update or the odometry init was never setted.");
        return Transform::Identity();
    }

    if( !this->m_model.isValidFrameIndex(frame_index) )
    {
        reportError("SimpleLeggedOdometry",
                    "getWorldFrameTransform",
                    "getWorldLinkTransform was called, but the request linkindex is not part of the model");
        return Transform::Identity();
    }

    LinkIndex linkIndex = this->m_model.getFrameLink(frame_index);
    Transform link_H_frame = m_model.getFrameTransform(frame_index);
    return getWorldLinkTransform(linkIndex) * link_H_frame;
}